

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::AsioHost::WorkerLoop(AsioHost *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  error_code ec;
  error_code local_1e8;
  string local_1d8 [32];
  LogStringBuffer local_1b8;
  
  local_1e8._M_value = 0;
  local_1e8._M_cat = (error_category *)std::_V2::system_category();
  this_00 = &local_1b8.LogStream;
  while (((this->Terminated)._M_base._M_i & 1U) == 0) {
    asio::io_context::run
              ((this->Context)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,&local_1e8);
    if (local_1e8._M_value != 0) {
      (**(code **)(*(long *)local_1e8._M_cat + 0x20))(local_1d8);
      if (DAT_0019e060 < 4) {
        local_1b8.ChannelName = ModuleLogger;
        local_1b8.LogLevel = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&DAT_0019e090);
        std::operator<<((ostream *)this_00,"Worker loop context error: ");
        std::operator<<((ostream *)this_00,local_1d8);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
      std::__cxx11::string::~string(local_1d8);
    }
  }
  return;
}

Assistant:

void AsioHost::WorkerLoop()
{
    asio::error_code ec;

    while (!Terminated)
    {
        Context->run(ec);

        if (ec) {
            ModuleLogger.Warning("Worker loop context error: ", ec.message());
        }
    }
}